

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O0

uint64_t duckdb::TimestampRangeInfo::ListLength
                   (timestamp_t start_value,timestamp_t end_value,interval_t increment_value,
                   bool inclusive_bound)

{
  timestamp_t timestamp;
  timestamp_t timestamp_00;
  interval_t iVar1;
  interval_t iVar2;
  bool bVar3;
  uint uVar4;
  InvalidInputException *pIVar5;
  ulong uVar6;
  long in_RCX;
  long in_RDX;
  int64_t in_RSI;
  int64_t in_RDI;
  byte in_R8B;
  uint64_t total_values;
  bool is_negative;
  bool is_positive;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  bool local_159;
  bool local_134;
  bool local_133;
  allocator local_131;
  string local_130 [32];
  long local_110;
  int64_t local_108;
  int64_t local_100;
  int64_t local_f8;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  long local_c8;
  int64_t local_c0;
  int64_t local_b8;
  int64_t local_b0;
  ulong local_a8;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [35];
  undefined1 local_75;
  allocator local_61;
  string local_60 [32];
  int64_t local_40;
  bool local_2b;
  bool local_2a;
  byte local_29;
  undefined8 local_28;
  int64_t local_20;
  timestamp_t local_18;
  timestamp_t local_10 [2];
  
  local_29 = in_R8B & 1;
  local_28._0_4_ = (int)in_RDX;
  local_133 = true;
  local_28._4_4_ = (int)((ulong)in_RDX >> 0x20);
  if (((int)local_28 < 1) && (local_133 = true, local_28._4_4_ < 1)) {
    local_133 = 0 < in_RCX;
  }
  local_2a = local_133;
  local_134 = true;
  if ((-1 < (int)local_28) && (local_134 = true, -1 < in_RDX)) {
    local_134 = in_RCX < 0;
  }
  local_2b = local_134;
  if ((local_134 == false) && (local_133 == false)) {
    return 0;
  }
  timestamp.value._7_1_ = in_stack_fffffffffffffe87;
  timestamp.value._0_7_ = in_stack_fffffffffffffe80;
  local_28 = in_RDX;
  local_20 = in_RCX;
  local_18.value = in_RSI;
  local_10[0].value = in_RDI;
  bVar3 = Timestamp::IsFinite(timestamp);
  if (bVar3) {
    local_40 = local_18.value;
    timestamp_00.value._7_1_ = in_stack_fffffffffffffe87;
    timestamp_00.value._0_7_ = in_stack_fffffffffffffe80;
    bVar3 = Timestamp::IsFinite(timestamp_00);
    if (bVar3) {
      if (((local_2b & 1U) != 0) && ((local_2a & 1U) != 0)) {
        local_9a = 1;
        pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_98,"Interval with mix of negative/positive entries not supported",&local_99
                  );
        duckdb::InvalidInputException::InvalidInputException(pIVar5,local_98);
        local_9a = 0;
        __cxa_throw(pIVar5,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      bVar3 = timestamp_t::operator>(local_10,&local_18);
      if ((bVar3) && ((local_2a & 1U) != 0)) {
        return 0;
      }
      bVar3 = timestamp_t::operator<(local_10,&local_18);
      if ((bVar3) && ((local_2b & 1U) != 0)) {
        return 0;
      }
      local_a8 = 0;
      if ((local_2b & 1U) == 0) {
        while( true ) {
          if ((local_29 & 1) == 0) {
            bVar3 = timestamp_t::operator<(local_10,&local_18);
          }
          else {
            bVar3 = timestamp_t::operator<=(local_10,&local_18);
          }
          if (bVar3 == false) break;
          local_100 = local_10[0].value;
          local_110 = local_28;
          local_108 = local_20;
          iVar1.micros = local_20;
          iVar1.months = (int)local_28;
          iVar1.days = local_28._4_4_;
          local_f8 = duckdb::Interval::Add(local_10[0],iVar1);
          uVar6 = local_a8 + 1;
          local_a8 = uVar6;
          local_10[0].value = local_f8;
          uVar4 = NumericLimits<unsigned_int>::Maximum();
          if (uVar4 < uVar6) {
            pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_130,"Lists larger than 2^32 elements are not supported",&local_131);
            duckdb::InvalidInputException::InvalidInputException(pIVar5,local_130);
            __cxa_throw(pIVar5,&InvalidInputException::typeinfo,
                        InvalidInputException::~InvalidInputException);
          }
        }
      }
      else {
        while( true ) {
          if ((local_29 & 1) == 0) {
            local_159 = timestamp_t::operator>(local_10,&local_18);
          }
          else {
            local_159 = timestamp_t::operator>=(local_10,&local_18);
          }
          if (local_159 == false) break;
          local_b8 = local_10[0].value;
          local_c8 = local_28;
          local_c0 = local_20;
          iVar2.micros = local_20;
          iVar2.months = (int)local_28;
          iVar2.days = local_28._4_4_;
          local_b0 = duckdb::Interval::Add(local_10[0],iVar2);
          uVar6 = local_a8 + 1;
          local_a8 = uVar6;
          local_10[0].value = local_b0;
          uVar4 = NumericLimits<unsigned_int>::Maximum();
          if (uVar4 < uVar6) {
            local_ea = 1;
            pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_e8,"Lists larger than 2^32 elements are not supported",&local_e9);
            duckdb::InvalidInputException::InvalidInputException(pIVar5,local_e8);
            local_ea = 0;
            __cxa_throw(pIVar5,&InvalidInputException::typeinfo,
                        InvalidInputException::~InvalidInputException);
          }
        }
      }
      return local_a8;
    }
  }
  local_75 = 1;
  pIVar5 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Interval infinite bounds not supported",&local_61);
  duckdb::InvalidInputException::InvalidInputException(pIVar5,local_60);
  local_75 = 0;
  __cxa_throw(pIVar5,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
  ;
}

Assistant:

static uint64_t ListLength(timestamp_t start_value, timestamp_t end_value, interval_t increment_value,
	                           bool inclusive_bound) {
		bool is_positive = increment_value.months > 0 || increment_value.days > 0 || increment_value.micros > 0;
		bool is_negative = increment_value.months < 0 || increment_value.days < 0 || increment_value.micros < 0;
		if (!is_negative && !is_positive) {
			// interval is 0: no result
			return 0;
		}
		// We don't allow infinite bounds because they generate errors or infinite loops
		if (!Timestamp::IsFinite(start_value) || !Timestamp::IsFinite(end_value)) {
			throw InvalidInputException("Interval infinite bounds not supported");
		}

		if (is_negative && is_positive) {
			// we don't allow a mix of
			throw InvalidInputException("Interval with mix of negative/positive entries not supported");
		}
		if (start_value > end_value && is_positive) {
			return 0;
		}
		if (start_value < end_value && is_negative) {
			return 0;
		}
		uint64_t total_values = 0;
		if (is_negative) {
			// negative interval, start_value is going down
			while (inclusive_bound ? start_value >= end_value : start_value > end_value) {
				start_value = Interval::Add(start_value, increment_value);
				total_values++;
				if (total_values > NumericLimits<uint32_t>::Maximum()) {
					throw InvalidInputException("Lists larger than 2^32 elements are not supported");
				}
			}
		} else {
			// positive interval, start_value is going up
			while (inclusive_bound ? start_value <= end_value : start_value < end_value) {
				start_value = Interval::Add(start_value, increment_value);
				total_values++;
				if (total_values > NumericLimits<uint32_t>::Maximum()) {
					throw InvalidInputException("Lists larger than 2^32 elements are not supported");
				}
			}
		}
		return total_values;
	}